

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Split.hpp
# Opt level: O3

tuple<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* CLI::detail::get_names
            (tuple<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *input)

{
  char c;
  pointer pcVar1;
  _Tuple_impl<0ul,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string>
  *p_Var2;
  pointer pbVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  BadNameString *pBVar7;
  long *plVar8;
  pointer pbVar9;
  long lVar10;
  pointer pbVar11;
  long lVar12;
  bool bVar13;
  string name;
  string pos_name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  long_names;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  short_names;
  value_type local_158;
  int local_138;
  undefined4 uStack_134;
  long local_130;
  long local_128 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  pointer local_c0;
  _Tuple_impl<0ul,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string>
  *local_b8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  local_118._M_string_length = 0;
  local_118.field_2._M_local_buf[0] = '\0';
  pbVar11 = (input->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar9 = (input->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pbVar3 = pbVar9;
  local_b8 = (_Tuple_impl<0ul,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string>
              *)__return_storage_ptr__;
  if (pbVar11 != pbVar9) {
    do {
      local_c0 = pbVar3;
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      pcVar1 = (pbVar11->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_158,pcVar1,pcVar1 + pbVar11->_M_string_length);
      if (local_158._M_string_length != 0) {
        if (local_158._M_string_length != 1) {
          if ((*local_158._M_dataplus._M_p == '-') && (local_158._M_dataplus._M_p[1] != '-')) {
            if ((local_158._M_string_length != 2) ||
               (bVar4 = valid_first_char<char>(local_158._M_dataplus._M_p[1]), !bVar4)) {
              pBVar7 = (BadNameString *)__cxa_allocate_exception(0x38);
              local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_50,local_158._M_dataplus._M_p,
                         local_158._M_dataplus._M_p + local_158._M_string_length);
              BadNameString::OneCharName(pBVar7,&local_50);
              __cxa_throw(pBVar7,&BadNameString::typeinfo,Error::~Error);
            }
            local_138 = 1;
            ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<int,char&>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_d8,&local_138,local_158._M_dataplus._M_p + 1);
            goto LAB_0013beaa;
          }
          if (2 < local_158._M_string_length) {
            ::std::__cxx11::string::substr((ulong)&local_138,(ulong)&local_158);
            iVar6 = ::std::__cxx11::string::compare((char *)&local_138);
            if ((long *)CONCAT44(uStack_134,local_138) != local_128) {
              operator_delete((long *)CONCAT44(uStack_134,local_138),local_128[0] + 1);
            }
            if (iVar6 == 0) {
              ::std::__cxx11::string::substr((ulong)&local_138,(ulong)&local_158);
              ::std::__cxx11::string::operator=((string *)&local_158,(string *)&local_138);
              if ((long *)CONCAT44(uStack_134,local_138) != local_128) {
                operator_delete((long *)CONCAT44(uStack_134,local_138),local_128[0] + 1);
              }
              if ((local_158._M_string_length == 0) ||
                 (bVar4 = valid_first_char<char>(*local_158._M_dataplus._M_p), !bVar4)) {
LAB_0013c1af:
                pBVar7 = (BadNameString *)__cxa_allocate_exception(0x38);
                local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_70,local_158._M_dataplus._M_p,
                           local_158._M_dataplus._M_p + local_158._M_string_length);
                BadNameString::BadLongName(pBVar7,&local_70);
                __cxa_throw(pBVar7,&BadNameString::typeinfo,Error::~Error);
              }
              ::std::__cxx11::string::substr((ulong)&local_138,(ulong)&local_158);
              plVar8 = (long *)CONCAT44(uStack_134,local_138);
              if (local_130 == 0) {
                bVar4 = true;
              }
              else {
                lVar12 = local_130 + -1;
                lVar10 = 0;
                do {
                  c = *(char *)((long)plVar8 + lVar10);
                  bVar5 = valid_first_char<char>(c);
                  bVar13 = (byte)(c - 0x2dU) < 2;
                  bVar4 = bVar5 || bVar13;
                  if (!bVar5 && !bVar13) break;
                  bVar5 = lVar12 != lVar10;
                  lVar10 = lVar10 + 1;
                } while (bVar5);
                plVar8 = (long *)CONCAT44(uStack_134,local_138);
              }
              if (plVar8 != local_128) {
                operator_delete(plVar8,local_128[0] + 1);
              }
              pbVar9 = local_c0;
              if (!bVar4) goto LAB_0013c1af;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&local_f8,&local_158);
              goto LAB_0013beaa;
            }
          }
        }
        iVar6 = ::std::__cxx11::string::compare((char *)&local_158);
        if ((iVar6 == 0) ||
           (iVar6 = ::std::__cxx11::string::compare((char *)&local_158), iVar6 == 0)) {
          pBVar7 = (BadNameString *)__cxa_allocate_exception(0x38);
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_90,local_158._M_dataplus._M_p,
                     local_158._M_dataplus._M_p + local_158._M_string_length);
          BadNameString::DashesOnly(pBVar7,&local_90);
          __cxa_throw(pBVar7,&BadNameString::typeinfo,Error::~Error);
        }
        if (local_118._M_string_length != 0) {
          pBVar7 = (BadNameString *)__cxa_allocate_exception(0x38);
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b0,local_158._M_dataplus._M_p,
                     local_158._M_dataplus._M_p + local_158._M_string_length);
          BadNameString::MultiPositionalNames(pBVar7,&local_b0);
          __cxa_throw(pBVar7,&BadNameString::typeinfo,Error::~Error);
        }
        ::std::__cxx11::string::_M_assign((string *)&local_118);
      }
LAB_0013beaa:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
      pbVar11 = pbVar11 + 1;
      pbVar3 = local_c0;
    } while (pbVar11 != pbVar9);
  }
  p_Var2 = local_b8;
  ::std::
  _Tuple_impl<0ul,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string>
  ::
  _Tuple_impl<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&,void>
            (local_b8,&local_d8,&local_f8,&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,
                    CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                             local_118.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d8);
  return (tuple<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)p_Var2;
}

Assistant:

inline std::tuple<std::vector<std::string>, std::vector<std::string>, std::string>
get_names(const std::vector<std::string> &input) {

    std::vector<std::string> short_names;
    std::vector<std::string> long_names;
    std::string pos_name;

    for(std::string name : input) {
        if(name.length() == 0) {
            continue;
        }
        if(name.length() > 1 && name[0] == '-' && name[1] != '-') {
            if(name.length() == 2 && valid_first_char(name[1]))
                short_names.emplace_back(1, name[1]);
            else
                throw BadNameString::OneCharName(name);
        } else if(name.length() > 2 && name.substr(0, 2) == "--") {
            name = name.substr(2);
            if(valid_name_string(name))
                long_names.push_back(name);
            else
                throw BadNameString::BadLongName(name);
        } else if(name == "-" || name == "--") {
            throw BadNameString::DashesOnly(name);
        } else {
            if(pos_name.length() > 0)
                throw BadNameString::MultiPositionalNames(name);
            pos_name = name;
        }
    }

    return std::tuple<std::vector<std::string>, std::vector<std::string>, std::string>(
        short_names, long_names, pos_name);
}